

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_dynlink_path_test.cpp
# Opt level: O0

void __thiscall
metacall_dynlink_path_test_DefaultConstructor_Test::TestBody
          (metacall_dynlink_path_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_t length;
  char name [9];
  dynlink_library_path_str path;
  int *in_stack_ffffffffffffef40;
  int *rhs;
  int *in_stack_ffffffffffffef48;
  char *in_stack_ffffffffffffef50;
  AssertionResult *this_00;
  undefined7 in_stack_ffffffffffffef58;
  undefined1 in_stack_ffffffffffffef5f;
  AssertHelper local_1088;
  Message local_1080;
  undefined4 local_1078;
  undefined4 local_1074;
  AssertionResult local_1070;
  uint local_105c;
  AssertHelper local_1058;
  Message local_1050 [3];
  undefined4 local_1038;
  undefined4 local_1034;
  AssertionResult local_1030;
  undefined8 local_1020;
  undefined8 local_1018;
  undefined1 local_1010;
  int local_1008 [1026];
  
  metacall_print_info();
  local_1018 = 0x6c6c61636174656d;
  local_1010 = 0;
  local_1020 = 0;
  printf("/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O0\n");
  fflush(_stdout);
  local_1034 = 0;
  local_1038 = dynlink_library_path(&local_1018,local_1008,&local_1020);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
             in_stack_ffffffffffffef50,in_stack_ffffffffffffef48,in_stack_ffffffffffffef40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1030);
  if (!bVar1) {
    testing::Message::Message(local_1050);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10a9f7);
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_dynlink_path_test/source/metacall_dynlink_path_test.cpp"
               ,0x31,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1058,local_1050);
    testing::internal::AssertHelper::~AssertHelper(&local_1058);
    testing::Message::~Message((Message *)0x10aa45);
  }
  local_105c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10aaa7);
  if (local_105c == 0) {
    pcVar2 = "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/build_O0";
    rhs = local_1008;
    printf("%s == %s\n");
    fflush(_stdout);
    local_1074 = 0;
    local_1078 = portability_path_compare(rhs,pcVar2);
    this_00 = &local_1070;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT17(in_stack_ffffffffffffef5f,in_stack_ffffffffffffef58),
               &this_00->success_,(int *)pcVar2,rhs);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_1080);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10ab8e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1088,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_dynlink_path_test/source/metacall_dynlink_path_test.cpp"
                 ,0x36,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1088,&local_1080);
      testing::internal::AssertHelper::~AssertHelper(&local_1088);
      testing::Message::~Message((Message *)0x10abda);
    }
    local_105c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ac36);
  }
  return;
}

Assistant:

TEST_F(metacall_dynlink_path_test, DefaultConstructor)
{
	metacall_print_info();

	dynlink_library_path_str path;

	const char name[] = "metacall"
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
						"d"
#endif
		;

	size_t length = 0;

	printf(METACALL_LIBRARY_PATH "\n");
	fflush(stdout);

	ASSERT_EQ((int)0, (int)dynlink_library_path(name, path, &length));

	printf("%s == %s\n", path, METACALL_LIBRARY_PATH);
	fflush(stdout);

	ASSERT_EQ((int)0, (int)portability_path_compare(path, METACALL_LIBRARY_PATH));
}